

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderbuffers.cpp
# Opt level: O0

void __thiscall FGLRenderBuffers::ClearFrameBuffer(FGLRenderBuffers *this,bool stencil,bool depth)

{
  uint local_24;
  GLdouble GStack_20;
  GLenum flags;
  GLdouble depthValue;
  GLint stencilValue;
  GLboolean scissorEnabled;
  bool depth_local;
  bool stencil_local;
  FGLRenderBuffers *this_local;
  
  depthValue._6_1_ = depth;
  depthValue._7_1_ = stencil;
  _stencilValue = this;
  (*_ptrc_glGetBooleanv)(0xc11,(GLboolean *)((long)&depthValue + 5));
  (*_ptrc_glGetIntegerv)(0xb91,(GLint *)&depthValue);
  (*_ptrc_glGetDoublev)(0xb73,&stack0xffffffffffffffe0);
  (*_ptrc_glDisable)(0xc11);
  (*_ptrc_glClearColor)(0.0,0.0,0.0,0.0);
  (*_ptrc_glClearDepth)(0.0);
  (*_ptrc_glClearStencil)(0);
  local_24 = 0x4000;
  if ((depthValue._7_1_ & 1) != 0) {
    local_24 = 0x4400;
  }
  if ((depthValue._6_1_ & 1) != 0) {
    local_24 = local_24 | 0x100;
  }
  (*_ptrc_glClear)(local_24);
  (*_ptrc_glClearStencil)(depthValue._0_4_);
  (*_ptrc_glClearDepth)(GStack_20);
  if (depthValue._5_1_ != '\0') {
    (*_ptrc_glEnable)(0xc11);
  }
  return;
}

Assistant:

void FGLRenderBuffers::ClearFrameBuffer(bool stencil, bool depth)
{
	GLboolean scissorEnabled;
	GLint stencilValue;
	GLdouble depthValue;
	glGetBooleanv(GL_SCISSOR_TEST, &scissorEnabled);
	glGetIntegerv(GL_STENCIL_CLEAR_VALUE, &stencilValue);
	glGetDoublev(GL_DEPTH_CLEAR_VALUE, &depthValue);
	glDisable(GL_SCISSOR_TEST);
	glClearColor(0.0, 0.0, 0.0, 0.0);
	glClearDepth(0.0);
	glClearStencil(0);
	GLenum flags = GL_COLOR_BUFFER_BIT;
	if (stencil)
		flags |= GL_STENCIL_BUFFER_BIT;
	if (depth)
		flags |= GL_DEPTH_BUFFER_BIT;
	glClear(flags);
	glClearStencil(stencilValue);
	glClearDepth(depthValue);
	if (scissorEnabled)
		glEnable(GL_SCISSOR_TEST);
}